

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::appender::append32
          (appender *this,char32_t code_point)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  bool local_15;
  bool ok;
  char32_t code_point_local;
  appender *this_local;
  
  local_15 = has_high_surrogate(this);
  if (!local_15) {
    __x = gsl::not_null::operator_cast_to_string_((not_null *)this);
    out = std::back_inserter<std::__cxx11::string>(__x);
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>(code_point,out);
  }
  local_15 = !local_15;
  return local_15;
}

Assistant:

bool string_matcher<Callbacks>::appender::append32 (char32_t const code_point) {
                bool ok = true;
                if (this->has_high_surrogate ()) {
                    // A high surrogate followed by something other than a low surrogate.
                    ok = false;
                } else {
                    utf::code_point_to_utf8<char> (code_point, std::back_inserter (*result_));
                }
                return ok;
            }